

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Audio.cpp
# Opt level: O3

void __thiscall Amiga::Audio::output(Audio *this)

{
  size_t sVar1;
  bool bVar2;
  size_t sVar3;
  Channel *this_00;
  long lVar4;
  Channel *modulands [4];
  Channel *local_68 [4];
  _Any_data local_48;
  code *local_38;
  code *local_30;
  
  this_00 = this->channels_;
  local_68[0] = this->channels_ + 1;
  local_68[1] = this->channels_ + 2;
  local_68[2] = this->channels_ + 3;
  local_68[3] = (Channel *)0x0;
  lVar4 = 0;
  do {
    bVar2 = Channel::output(this_00,*(Channel **)((long)local_68 + lVar4 * 4));
    if (bVar2) {
      DMADeviceBase::posit_interrupt((DMADeviceBase *)this,*(FlagT *)((long)&DAT_004a8ee0 + lVar4));
    }
    lVar4 = lVar4 + 2;
    this_00 = this_00 + 1;
  } while (lVar4 != 8);
  sVar1 = this->sample_pointer_;
  if (sVar1 == 0) {
    sVar3 = this->buffer_pointer_;
    do {
    } while ((this->buffer_available_[sVar3]._M_base._M_i & 1U) == 0);
  }
  else {
    sVar3 = this->buffer_pointer_;
  }
  this->buffer_[sVar3]._M_elems[sVar1] =
       ((ushort)this->channels_[2].output_enabled * (short)this->channels_[2].output_level +
       (ushort)this->channels_[1].output_enabled * (short)this->channels_[1].output_level) * 0x80;
  this->buffer_[sVar3]._M_elems[sVar1 + 1] =
       ((ushort)this->channels_[3].output_enabled * (short)this->channels_[3].output_level +
       (ushort)this->channels_[0].output_enabled * (short)this->channels_[0].output_level) * 0x80;
  this->sample_pointer_ = sVar1 + 2;
  if (sVar1 + 2 == 0x1000) {
    this->buffer_available_[sVar3]._M_base._M_i = false;
    local_48._8_8_ = 0;
    local_48._M_unused._M_object = operator_new(0x18);
    *(Audio **)local_48._M_unused._0_8_ = this;
    *(AudioBuffer **)((long)local_48._M_unused._0_8_ + 8) = this->buffer_ + sVar3;
    *(atomic<bool> **)((long)local_48._M_unused._0_8_ + 0x10) = this->buffer_available_ + sVar3;
    local_30 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/MaddTheSane[P]CLK/Machines/Amiga/Audio.cpp:159:18)>
               ::_M_invoke;
    local_38 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/MaddTheSane[P]CLK/Machines/Amiga/Audio.cpp:159:18)>
               ::_M_manager;
    Concurrency::AsyncTaskQueue<true,_true,_void>::enqueue
              (&this->queue_,(function<void_()> *)&local_48);
    if (local_38 != (code *)0x0) {
      (*local_38)(&local_48,&local_48,__destroy_functor);
    }
    this->buffer_pointer_ = ((this->buffer_pointer_ + 1) / 3) * -3 + this->buffer_pointer_ + 1;
    this->sample_pointer_ = 0;
  }
  return;
}

Assistant:

void Audio::output() {
	constexpr InterruptFlag::FlagT interrupts[] = {
		InterruptFlag::AudioChannel0,
		InterruptFlag::AudioChannel1,
		InterruptFlag::AudioChannel2,
		InterruptFlag::AudioChannel3,
	};
	Channel *const modulands[] = {
		&channels_[1],
		&channels_[2],
		&channels_[3],
		nullptr,
	};

	for(int c = 0; c < 4; c++) {
		if(channels_[c].output(modulands[c])) {
			posit_interrupt(interrupts[c]);
		}
	}

	// Spin until the next buffer is available if just entering it for the first time.
	// Contention here should be essentially non-existent.
	if(!sample_pointer_) {
		while(!buffer_available_[buffer_pointer_].load(std::memory_order::memory_order_relaxed));
	}

	// Left.
	static_assert(std::tuple_size<AudioBuffer>::value % 2 == 0);
	buffer_[buffer_pointer_][sample_pointer_] = int16_t(
		(
			channels_[1].output_level * channels_[1].output_enabled +
			channels_[2].output_level * channels_[2].output_enabled
		) << 7
	);

	// Right.
	buffer_[buffer_pointer_][sample_pointer_ + 1] = int16_t(
		(
			channels_[0].output_level * channels_[0].output_enabled +
			channels_[3].output_level * channels_[3].output_enabled
		) << 7
	);
	sample_pointer_ += 2;

	if(sample_pointer_ == buffer_[buffer_pointer_].size()) {
		const auto &buffer = buffer_[buffer_pointer_];
		auto &flag = buffer_available_[buffer_pointer_];

		flag.store(false, std::memory_order::memory_order_release);
		queue_.enqueue([this, &buffer, &flag] {
			speaker_.push(buffer.data(), buffer.size() >> 1);
			flag.store(true, std::memory_order::memory_order_relaxed);
		});

		buffer_pointer_ = (buffer_pointer_ + 1) % BufferCount;
		sample_pointer_ = 0;
	}
}